

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingNegativeCase::SamplerBindingNegativeCase
          (SamplerBindingNegativeCase *this,Context *context,char *name,char *desc,
          ShaderType shaderType,TestType testType,ErrorType errorType,GLenum samplerType)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_sampler","");
  LayoutBindingNegativeCase::LayoutBindingNegativeCase
            (&this->super_LayoutBindingNegativeCase,context,name,desc,shaderType,testType,errorType,
             0x8b4d,0x8b4c,0x8e81,0x8e82,0x8872,0x8b4d,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_LayoutBindingNegativeCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__SamplerBindingNegativeCase_00b49aa0;
  *(GLenum *)&(this->super_LayoutBindingNegativeCase).field_0x134 = samplerType;
  return;
}

Assistant:

SamplerBindingNegativeCase::SamplerBindingNegativeCase (Context&		context,
														const char*		name,
														const char*		desc,
														ShaderType		shaderType,
														TestType		testType,
														ErrorType		errorType,
														glw::GLenum		samplerType)
	: LayoutBindingNegativeCase		(context,
									 name,
									 desc,
									 shaderType,
									 testType,
									 errorType,
									 GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,
									 GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,
									 GL_MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS,
									 GL_MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS,
									 GL_MAX_TEXTURE_IMAGE_UNITS,
									 GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,
									 "u_sampler")
	, m_samplerType					(samplerType)
{
}